

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddInv.c
# Opt level: O0

DdNode * Cudd_addScalarInverse(DdManager *dd,DdNode *f,DdNode *epsilon)

{
  DdNode *res;
  DdNode *epsilon_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (epsilon->index == 0x7fffffff) {
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)cuddAddScalarInverseRecur(dd,f,epsilon);
    } while (dd->reordered == 1);
  }
  else {
    fprintf((FILE *)dd->err,"Invalid epsilon\n");
    dd_local = (DdManager *)0x0;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addScalarInverse(
  DdManager * dd,
  DdNode * f,
  DdNode * epsilon)
{
    DdNode *res;

    if (!cuddIsConstant(epsilon)) {
        (void) fprintf(dd->err,"Invalid epsilon\n");
        return(NULL);
    }
    do {
        dd->reordered = 0;
        res  = cuddAddScalarInverseRecur(dd,f,epsilon);
    } while (dd->reordered == 1);
    return(res);

}